

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O2

void __thiscall
QWidgetRepaintManager::flush
          (QWidgetRepaintManager *this,QWidget *widget,QRegion *region,
          QPlatformTextureList *widgetTextures)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  QPoint *pQVar4;
  long lVar5;
  QLoggingCategory *pQVar6;
  QDebug *pQVar7;
  long *plVar8;
  QWidget *pQVar9;
  QWindow *pQVar10;
  char *t;
  long in_FS_OFFSET;
  QDebug local_98;
  QRegion local_90;
  QDebug local_88;
  undefined1 local_80 [16];
  QDebug local_70;
  undefined1 local_68 [8];
  QPoint local_60;
  QPoint local_58;
  undefined4 uStack_50;
  undefined8 uStack_4c;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QWidget::testAttribute_helper(*(QWidget **)this,WA_DontShowOnScreen);
  if (!bVar2) {
    bVar2 = QWidget::testAttribute_helper(widget,WA_DontShowOnScreen);
    if (!bVar2) {
      pQVar4 = (QPoint *)QWidget::windowHandle(widget);
      iVar3 = QWindow::type();
      if (iVar3 != 0x21) {
        if (flush(QWidget*,QRegion_const&,QPlatformTextureList*)::fpsDebug == '\0') {
          iVar3 = __cxa_guard_acquire(&flush(QWidget*,QRegion_const&,QPlatformTextureList*)::
                                       fpsDebug);
          if (iVar3 != 0) {
            iVar3 = qEnvironmentVariableIntValue("QT_DEBUG_FPS",(bool *)0x0);
            flush::fpsDebug = iVar3 != 0;
            __cxa_guard_release(&flush(QWidget*,QRegion_const&,QPlatformTextureList*)::fpsDebug);
          }
        }
        if (flush::fpsDebug == true) {
          iVar3 = *(int *)(this + 0xa0);
          *(int *)(this + 0xa0) = iVar3 + 1;
          if (iVar3 == 0) {
            QElapsedTimer::start();
          }
          lVar5 = QElapsedTimer::elapsed();
          if (5000 < lVar5) {
            iVar3 = *(int *)(this + 0xa0);
            lVar5 = QElapsedTimer::restart();
            local_58.xp.m_i = 2;
            local_44 = 0;
            local_58.yp.m_i = 0;
            uStack_50 = 0;
            uStack_4c = 0;
            local_40 = "default";
            QMessageLogger::debug
                      ((char *)&local_58,(double)(iVar3 * 1000) / (double)lVar5,"FPS: %.1f\n");
            *(undefined4 *)(this + 0xa0) = 0;
          }
        }
        local_60.xp.m_i = 0;
        local_60.yp.m_i = 0;
        if (*(QWidget **)this != widget) {
          local_58.xp.m_i = 0;
          local_58.yp.m_i = 0;
          local_60 = QWidget::mapTo(widget,*(QWidget **)this,&local_58);
        }
        uVar1 = *(uint *)(*(long *)&widget->field_0x8 + 0x250);
        pQVar6 = QtPrivateLogging::lcWidgetPainting();
        if (((pQVar6->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
          local_40 = pQVar6->name;
          local_58.xp.m_i = 2;
          local_58.yp.m_i = 0;
          uStack_50 = 0;
          uStack_4c = 0;
          local_44 = 0;
          QMessageLogger::debug();
          pQVar7 = QDebug::operator<<(&local_98,"Flushing");
          local_90.d = (QRegionData *)pQVar7->stream;
          *(int *)((Stream *)local_90.d + 0x28) = *(int *)((Stream *)local_90.d + 0x28) + 1;
          ::operator<<((Stream *)&local_88,&local_90);
          pQVar7 = QDebug::operator<<(&local_88,"of");
          local_80._0_8_ = pQVar7->stream;
          *(int *)(local_80._0_8_ + 0x28) = *(int *)(local_80._0_8_ + 0x28) + 1;
          ::operator<<((Stream *)(local_80 + 8),(QWidget *)local_80);
          pQVar7 = QDebug::operator<<((QDebug *)(local_80 + 8),"to");
          local_70.stream = pQVar7->stream;
          *(int *)(local_70.stream + 0x28) = *(int *)(local_70.stream + 0x28) + 1;
          ::operator<<((Stream *)local_68,(QWindow *)&local_70);
          t = "using RHI";
          if ((uVar1 >> 0x1c & 1) == 0) {
            t = "";
          }
          QDebug::operator<<((QDebug *)local_68,t);
          QDebug::~QDebug((QDebug *)local_68);
          QDebug::~QDebug(&local_70);
          QDebug::~QDebug((QDebug *)(local_80 + 8));
          QDebug::~QDebug((QDebug *)local_80);
          QDebug::~QDebug(&local_88);
          QDebug::~QDebug((QDebug *)&local_90);
          QDebug::~QDebug(&local_98);
        }
        if ((uVar1 >> 0x1c & 1) == 0) {
          QBackingStore::flush(*(QRegion **)(this + 8),(QWindow *)region,pQVar4);
        }
        else {
          if (widgetTextures == (QPlatformTextureList *)0x0) {
            if ((char)QtGlobalStatic::
                      Holder<(anonymous_namespace)::Q_QGS_qt_dummy_platformTextureList>::guard.
                      _q_value.super___atomic_base<signed_char>._M_i < -1) {
              widgetTextures = (QPlatformTextureList *)0x0;
            }
            else {
              widgetTextures =
                   (QPlatformTextureList *)
                   QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_dummy_platformTextureList>_>
                   ::instance();
            }
          }
          QWidgetPrivate::sendComposeStatus(widget,false);
          bVar2 = QWidget::testAttribute_helper(widget,WA_TranslucentBackground);
          plVar8 = (long *)QBackingStore::handle();
          QPaintDevice::devicePixelRatio();
          iVar3 = (**(code **)(*plVar8 + 0x20))(plVar8,pQVar4,region,&local_60,widgetTextures,bVar2)
          ;
          QWidgetPrivate::sendComposeStatus(widget,true);
          if (iVar3 == 2) {
            pQVar9 = QWidget::window(widget);
            qSendWindowChangeToTextureChildrenRecursively(pQVar9,WindowAboutToChangeInternal);
            pQVar10 = (QWindow *)QBackingStore::handle();
            QPlatformBackingStore::graphicsDeviceReportedLost(pQVar10);
            pQVar9 = QWidget::window(widget);
            qSendWindowChangeToTextureChildrenRecursively(pQVar9,WindowChangeInternal);
            QWidget::update(widget);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetRepaintManager::flush(QWidget *widget, const QRegion &region, QPlatformTextureList *widgetTextures)
{
    Q_ASSERT(!region.isEmpty() || widgetTextures);
    Q_ASSERT(widget);
    Q_ASSERT(tlw);

    if (tlw->testAttribute(Qt::WA_DontShowOnScreen) || widget->testAttribute(Qt::WA_DontShowOnScreen))
        return;

    QWindow *window = widget->windowHandle();
    // We should only be flushing to native widgets
    Q_ASSERT(window);

    // Foreign Windows do not have backing store content and must not be flushed
    if (window->type() == Qt::ForeignWindow)
        return;

    static bool fpsDebug = qEnvironmentVariableIntValue("QT_DEBUG_FPS");
    if (fpsDebug) {
        if (!perfFrames++)
            perfTime.start();
        if (perfTime.elapsed() > 5000) {
            double fps = double(perfFrames * 1000) / perfTime.restart();
            qDebug("FPS: %.1f\n", fps);
            perfFrames = 0;
        }
    }

    QPoint offset;
    if (widget != tlw)
        offset += widget->mapTo(tlw, QPoint());

    // A widget uses RHI flush if itself, or one of its non-native children
    // uses RHI for its drawing. If so, we composite the backing store raster
    // data along with textures produced by the RHI widgets.
    const bool flushWithRhi = widget->d_func()->usesRhiFlush;

    qCDebug(lcWidgetPainting) << "Flushing" << region << "of" << widget
        << "to" << window << (flushWithRhi ? "using RHI" : "");

    // A widget uses RHI flush if itself, or one of its non-native children
    // uses RHI for its drawing. If so, we composite the backing store raster
    // data along with textures produced by the RHI widgets.
    if (flushWithRhi) {
        if (!widgetTextures)
            widgetTextures = qt_dummy_platformTextureList;

        // We only need to let the widget sub-hierarchy that
        // we are flushing know that we're compositing.
        auto *widgetPrivate = QWidgetPrivate::get(widget);
        widgetPrivate->sendComposeStatus(widget, false);

        // A window may have alpha even when the app did not request
        // WA_TranslucentBackground. Therefore the compositor needs to know whether the app intends
        // to rely on translucency, in order to decide if it should clear to transparent or opaque.
        const bool translucentBackground = widget->testAttribute(Qt::WA_TranslucentBackground);

        QPlatformBackingStore::FlushResult flushResult;
        flushResult = store->handle()->rhiFlush(window,
                                                widget->devicePixelRatio(),
                                                region,
                                                offset,
                                                widgetTextures,
                                                translucentBackground);

        widgetPrivate->sendComposeStatus(widget, true);

        if (flushResult == QPlatformBackingStore::FlushFailedDueToLostDevice) {
            qSendWindowChangeToTextureChildrenRecursively(widget->window(),
                                                          QEvent::WindowAboutToChangeInternal);
            store->handle()->graphicsDeviceReportedLost(window);
            qSendWindowChangeToTextureChildrenRecursively(widget->window(),
                                                          QEvent::WindowChangeInternal);
            widget->update();
        }
    } else {
        store->flush(region, window, offset);
    }
}